

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

DUMB_RESAMPLER *
dumb_start_resampler_n(int n,void *src,int src_channels,int32 pos,int32 start,int32 end,int quality)

{
  DUMB_RESAMPLER *pDVar1;
  int in_EDX;
  undefined8 in_RSI;
  int in_EDI;
  int32 end_00;
  int32 start_00;
  int32 in_stack_fffffffffffffff0;
  sample_t_conflict *in_stack_fffffffffffffff8;
  
  start_00 = (int32)((ulong)in_RSI >> 0x20);
  end_00 = (int32)in_RSI;
  if (in_EDI == 8) {
    pDVar1 = dumb_start_resampler_8
                       ((char *)in_stack_fffffffffffffff8,8,in_stack_fffffffffffffff0,start_00,
                        end_00,in_EDX);
  }
  else if (in_EDI == 0x10) {
    pDVar1 = dumb_start_resampler_16
                       ((short *)in_stack_fffffffffffffff8,0x10,in_stack_fffffffffffffff0,start_00,
                        end_00,in_EDX);
  }
  else {
    pDVar1 = dumb_start_resampler
                       (in_stack_fffffffffffffff8,in_EDI,in_stack_fffffffffffffff0,start_00,end_00,
                        in_EDX);
  }
  return pDVar1;
}

Assistant:

DUMB_RESAMPLER *dumb_start_resampler_n(int n, void *src, int src_channels, int32 pos, int32 start, int32 end, int quality)
{
	if (n == 8)
		return dumb_start_resampler_8(src, src_channels, pos, start, end, quality);
	else if (n == 16)
		return dumb_start_resampler_16(src, src_channels, pos, start, end, quality);
	else
		return dumb_start_resampler(src, src_channels, pos, start, end, quality);
}